

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char * kj::_::fill<kj::ArrayPtr<char_const>>(char *target,ArrayPtr<const_char> *first)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  
  pcVar1 = first->ptr;
  sVar2 = first->size_;
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    target[sVar3] = pcVar1[sVar3];
  }
  return target + sVar3;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}